

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * __thiscall
util::make_string<std::__cxx11::string&,char_const(&)[24]>
          (string *__return_storage_ptr__,util *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [24])

{
  size_t sVar1;
  ostringstream ss;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_198,*(char **)this,*(long *)(this + 8));
  sVar1 = strlen((char *)args);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_198,(char *)args,sVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}